

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::PatchGetValueWithThisPtr<false,Js::PolymorphicInlineCache>
              (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
              InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var thisInstance)

{
  code *pcVar1;
  PropertyId propertyId_00;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext;
  undefined4 *puVar4;
  PropertyRecord *pPVar5;
  undefined1 local_a0 [8];
  PropertyValueInfo info;
  Var value;
  RecyclableObject *local_40;
  RecyclableObject *object;
  
  object._4_4_ = propertyId;
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  bVar2 = JavascriptStackWalker::ValidateTopJitFrame(scriptContext);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1f02,
                                "(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext))",
                                "Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_40 = (RecyclableObject *)0x0;
  BVar3 = GetPropertyObject(instance,scriptContext,&local_40);
  if (BVar3 == 0) {
    bVar2 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
    if (bVar2) {
      pPVar5 = ScriptContext::GetPropertyName(scriptContext,object._4_4_);
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec48,(PCWSTR)(pPVar5 + 1));
    }
    info._56_8_ = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    local_a0 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_a0,functionBody,inlineCache,inlineCacheIndex,true);
    propertyId_00 = object._4_4_;
    bVar2 = CacheOperators::TryGetProperty<true,true,true,true,true,true,false,true,false,false>
                      (instance,false,local_40,object._4_4_,(Var *)&info.inlineCacheIndex,
                       scriptContext,(PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_a0
                      );
    if (!bVar2) {
      bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,InlineCachePhase);
      if ((bVar2) && (DAT_015d346a == '\x01')) {
        CacheOperators::TraceCache
                  (inlineCache,L"PatchGetValue",propertyId_00,scriptContext,local_40);
      }
      info._56_8_ = GetProperty(thisInstance,local_40,propertyId_00,scriptContext,
                                (PropertyValueInfo *)local_a0);
    }
  }
  return (Var)info._56_8_;
}

Assistant:

__forceinline Var JavascriptOperators::PatchGetValueWithThisPtr(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var thisInstance)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetValueWithThisPtr);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        Assert(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext));

        RecyclableObject* object = nullptr;
        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined,
                    scriptContext->GetPropertyName(propertyId)->GetBuffer());
            }
            else
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
        }

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        Var value;
        if (CacheOperators::TryGetProperty<true, true, true, true, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
                instance, false, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetValue"), propertyId, scriptContext, object);
        }
#endif

        return JavascriptOperators::GetProperty(thisInstance, object, propertyId, scriptContext, &info);
        JIT_HELPER_END(Op_PatchGetValueWithThisPtr);
    }